

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O2

wchar_t rar5_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  rar5 *prVar1;
  wchar_t *pwVar2;
  file_header *pfVar3;
  undefined1 *puVar4;
  int64_t *piVar5;
  byte bVar6;
  compressed_block_header cVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  rar5 *rar;
  rar5 *prVar11;
  uint16_t uVar12;
  byte bVar13;
  wchar_t wVar14;
  wchar_t wVar15;
  int iVar16;
  int iVar17;
  uint32_t uVar18;
  wchar_t wVar19;
  ssize_t sVar20;
  uint8_t *puVar21;
  uint *puVar22;
  void *pvVar23;
  decode_table *pdVar24;
  long lVar25;
  sbyte sVar26;
  uint32_t uVar27;
  long lVar28;
  char *pcVar29;
  ulong uVar30;
  rar5 *prVar31;
  size_t sVar32;
  size_t sVar33;
  uint8_t uVar34;
  ulong uVar35;
  ulong uVar36;
  long lVar37;
  uint uVar38;
  rar5 *prVar39;
  data_ready *pdVar40;
  uint uVar41;
  uint8_t *puVar42;
  size_t sVar43;
  bool bVar44;
  ulong local_278;
  ushort local_262;
  decode_table *local_260;
  rar5 *local_258;
  uint8_t *local_250;
  uint16_t num;
  uint16_t num_1;
  uint8_t *p;
  decode_table *local_238;
  uint local_22c;
  uint8_t bit_length [20];
  uint8_t table [430];
  
  rar = (rar5 *)a->format->data;
  if (size != (size_t *)0x0) {
    *size = 0;
  }
  if (rar->has_encrypted_entries == L'\xffffffff') {
    rar->has_encrypted_entries = L'\0';
  }
  if ((rar->headers_are_encrypted != L'\0') || ((*(byte *)&rar->cstate & 0x10) != 0)) {
    pcVar29 = "Reading encrypted data is not currently supported";
    iVar17 = 0x54;
LAB_00129aa8:
    archive_set_error(&a->archive,iVar17,pcVar29);
    return L'\xffffffe2';
  }
  bVar13 = (rar->file).field_0x20;
  if ((bVar13 & 8) != 0) {
    archive_set_error(&a->archive,0x54,"Can\'t decompress an entry marked as a directory");
    return L'\xffffffe7';
  }
  if ((rar->skip_mode == L'\0') && ((rar->file).unpacked_size < (rar->cstate).last_write_ptr)) {
    pcVar29 = "Unpacker has written too many bytes";
    iVar17 = 0x16;
    goto LAB_00129aa8;
  }
  if ((rar->cstate).dready[0].used != '\0') {
    pdVar40 = (rar->cstate).dready;
LAB_00129b04:
    if (buff != (void **)0x0) {
      *buff = pdVar40->buf;
    }
    if (size != (size_t *)0x0) {
      *size = pdVar40->size;
    }
    if (offset != (int64_t *)0x0) {
      *offset = pdVar40->offset;
    }
    pdVar40->used = '\0';
    return L'\0';
  }
  if ((rar->cstate).dready[1].used != '\0') {
    pdVar40 = (rar->cstate).dready + 1;
    goto LAB_00129b04;
  }
  if ((bVar13 & 4) != 0) {
    return L'\x01';
  }
  if ((bVar13 & 2) == 0) {
    wVar19 = (rar->cstate).method;
    if ((uint)(wVar19 + L'\xffffffff') < 5) {
      if (offset != (int64_t *)0x0) {
        *offset = (rar->cstate).last_write_ptr;
      }
      wVar19 = L'\x01';
LAB_00129b63:
      prVar11 = (rar5 *)a->format->data;
      bVar13 = *(byte *)&prVar11->cstate;
      if ((bVar13 & 1) == 0) {
        puVar42 = (prVar11->cstate).window_buf;
        if (((ulong)prVar11->main & 1) == 0) {
LAB_00129b97:
          (prVar11->file).calculated_crc32 = 0;
          lVar25 = (prVar11->cstate).window_size;
          sVar20 = lVar25 + -1;
          if (lVar25 == 0) {
            sVar20 = 0;
          }
          (prVar11->cstate).window_mask = sVar20;
          free(puVar42);
          free((prVar11->cstate).filtered_buf);
          sVar33 = (prVar11->cstate).window_size;
          puVar42 = (uint8_t *)0x0;
          puVar21 = (uint8_t *)0x0;
          if (0 < (long)sVar33) {
            puVar42 = (uint8_t *)calloc(1,sVar33);
            puVar21 = (uint8_t *)calloc(1,sVar33);
          }
          (prVar11->cstate).window_buf = puVar42;
          (prVar11->cstate).filtered_buf = puVar21;
          *(undefined8 *)(prVar11->cstate).dready = 0;
          (prVar11->cstate).dready[0].buf = (uint8_t *)0x0;
          (prVar11->cstate).dready[0].size = 0;
          (prVar11->cstate).dready[0].offset = 0;
          *(undefined8 *)((prVar11->cstate).dready + 1) = 0;
          (prVar11->cstate).dready[1].buf = (uint8_t *)0x0;
          (prVar11->cstate).dready[1].size = 0;
          (prVar11->cstate).dready[1].offset = 0;
          (prVar11->cstate).write_ptr = 0;
          (prVar11->cstate).last_write_ptr = 0;
          memset(&(prVar11->cstate).bd,0,0x4a9c);
          bVar13 = *(byte *)&prVar11->cstate;
        }
        else if (puVar42 == (uint8_t *)0x0) {
          puVar42 = (uint8_t *)0x0;
          goto LAB_00129b97;
        }
        bVar13 = bVar13 | 1;
        *(byte *)&prVar11->cstate = bVar13;
      }
      if ((prVar11->cstate).window_size == 0) {
        pcVar29 = "Invalid window size declaration in this file";
        goto LAB_0012abcb;
      }
      if ((bVar13 & 2) != 0) {
LAB_00129d07:
        prVar39 = (rar5 *)a->format->data;
        if (((((ulong)prVar39->main & 2) != 0) && ((prVar39->file).bytes_remaining == 0)) &&
           (wVar15 = advance_multivolume(a), wVar15 != L'\0')) goto LAB_0012a984;
        local_258 = prVar39;
        if ((undefined1  [19312])((undefined1  [19312])prVar39->cstate & (undefined1  [19312])0x8)
            == (undefined1  [19312])0x0) {
          p = (prVar39->cstate).block_buf;
          goto LAB_00129e8f;
        }
        wVar15 = read_ahead(a,6,&p);
        if (wVar15 == L'\0') {
          return L'\x01';
        }
        cVar7.block_flags_u8 = p[0];
        cVar7.block_cksum = p[1];
        prVar39->last_block_hdr = cVar7;
        bVar13 = cVar7.block_flags_u8 >> 3 & 7;
        uVar30 = (ulong)bVar13;
        if (bVar13 < 3) {
          if (bVar13 == 2) {
            puVar42 = (uint8_t *)(ulong)(*(uint *)(p + 2) & 0xffffff);
          }
          else if (bVar13 == 1) {
            puVar42 = (uint8_t *)(ulong)*(ushort *)(p + 2);
          }
          else {
            puVar42 = (uint8_t *)(ulong)p[2];
          }
          if ((((uint)((ulong)puVar42 >> 0x10) ^ (uint)puVar42 ^
               (uint)((ulong)puVar42 >> 8) ^ (uint)(cVar7.block_flags_u8 ^ 0x5a)) & 0xff) !=
              (uint)((ushort)cVar7 >> 8)) {
            archive_set_error(&a->archive,0x54,"Block checksum error: got 0x%x, expected 0x%x");
            return L'\xffffffe2';
          }
          wVar15 = consume(a,(ulong)(byte)(bVar13 + 3));
          if (wVar15 != L'\0') {
            return L'\x01';
          }
          lVar25 = (prVar39->file).bytes_remaining - (ulong)(byte)(bVar13 + 3);
          (prVar39->file).bytes_remaining = lVar25;
          if ((long)puVar42 <= lVar25) {
            *(byte *)&prVar39->cstate = *(byte *)&prVar39->cstate & 0xfb;
            wVar15 = read_ahead(a,(size_t)(puVar42 + 4),&p);
            if (wVar15 == L'\0') {
              return L'\x01';
            }
LAB_00129e5d:
            puVar21 = p;
            (prVar39->cstate).block_buf = p;
            (prVar39->cstate).cur_block_size = (ssize_t)puVar42;
            *(byte *)&prVar39->cstate = *(byte *)&prVar39->cstate & 0xf7;
            (prVar39->bits).in_addr = L'\0';
            (prVar39->bits).bit_addr = '\0';
            if ((char)(prVar39->last_block_hdr).block_flags_u8 < '\0') {
              local_260 = (decode_table *)CONCAT71(local_260._1_7_,4);
              wVar15 = L'\0';
              iVar17 = 0;
              uVar38 = 0xf0;
              sVar26 = 4;
              do {
                local_250 = (uint8_t *)(CONCAT71(local_250._1_7_,sVar26) ^ 4);
                while( true ) {
                  if (0x13 < iVar17) {
                    (prVar39->bits).in_addr = wVar15;
                    (prVar39->bits).bit_addr = (byte)local_260 ^ 4;
                    pdVar24 = &(prVar39->cstate).bd;
                    create_decode_tables(bit_length,pdVar24,L'\x14');
                    uVar38 = 0;
                    local_260 = pdVar24;
                    goto LAB_0012a66a;
                  }
                  if ((long)puVar42 <= (long)wVar15) {
                    iVar17 = 0x54;
                    pcVar29 = "Truncated data in huffman tables";
                    goto LAB_0012a975;
                  }
                  uVar41 = (uVar38 & p[wVar15]) >> (byte)local_260;
                  wVar15 = wVar15 + (uint)(uVar38 == 0xf);
                  lVar25 = (long)iVar17;
                  if (uVar41 != 0xf) break;
                  uVar41 = (uint)p[wVar15] & (uVar38 ^ 0xff);
                  wVar15 = wVar15 + (uint)(uVar38 == 0xf0);
                  if (uVar41 >> (sbyte)local_250 == 0) {
                    iVar17 = iVar17 + 1;
                    bit_length[lVar25] = '\x0f';
                  }
                  else {
                    for (lVar28 = 0;
                        ((uint)lVar28 < (uVar41 >> (sbyte)local_250) + 2 && (lVar25 + lVar28 < 0x14)
                        ); lVar28 = lVar28 + 1) {
                      bit_length[lVar28 + lVar25] = '\0';
                    }
                    iVar17 = iVar17 + (uint)lVar28;
                    prVar39 = local_258;
                  }
                }
                iVar17 = iVar17 + 1;
                bit_length[lVar25] = (uint8_t)uVar41;
                local_260 = (decode_table *)CONCAT71(local_260._1_7_,(sbyte)local_250);
                uVar38 = uVar38 ^ 0xff;
                sVar26 = (sbyte)local_250;
              } while( true );
            }
            goto LAB_00129e8f;
          }
          pdVar24 = (decode_table *)a->format->data;
          if (pdVar24->decode_len[2] == 0) {
            *(byte *)(pdVar24->decode_len + 0xd) = (byte)pdVar24->decode_len[0xd] | 4;
            local_260 = pdVar24;
            free(*(void **)(pdVar24[5].quick_num + 0x202));
            pvVar23 = malloc((size_t)(puVar42 + 8));
            *(void **)(local_260[5].quick_num + 0x202) = pvVar23;
            if (pvVar23 != (void *)0x0) {
              puVar21 = (uint8_t *)((long)pvVar23 + (long)puVar42);
              puVar21[0] = '\0';
              puVar21[1] = '\0';
              puVar21[2] = '\0';
              puVar21[3] = '\0';
              puVar21[4] = '\0';
              puVar21[5] = '\0';
              puVar21[6] = '\0';
              puVar21[7] = '\0';
              puVar21 = (uint8_t *)0x0;
              pdVar24 = local_260;
              do {
                do {
                  sVar43 = (long)puVar42 - (long)puVar21;
                  if ((long)*(size_t *)(pdVar24[5].quick_len + 0x84) < (long)puVar42 - (long)puVar21
                     ) {
                    sVar43 = *(size_t *)(pdVar24[5].quick_len + 0x84);
                  }
                  if (sVar43 == 0) {
                    iVar17 = 0x54;
                    pcVar29 = "Encountered block size == 0 during block merge";
                    goto LAB_0012a975;
                  }
                  wVar14 = read_ahead(a,sVar43,(uint8_t **)table);
                  pdVar24 = local_260;
                  wVar15 = wVar19;
                  if (wVar14 == L'\0') goto LAB_0012a984;
                  if ((long)puVar42 < (long)(puVar21 + sVar43)) {
                    iVar17 = 0x16;
                    pcVar29 = "Consumed too much data when merging blocks.";
                    goto LAB_0012a975;
                  }
                  local_250 = puVar21 + sVar43;
                  memcpy(puVar21 + *(long *)(local_260[5].quick_num + 0x202),(void *)table._0_8_,
                         sVar43);
                  wVar14 = consume(a,sVar43);
                  puVar21 = local_250;
                  if (wVar14 != L'\0') goto LAB_0012a984;
                  sVar32 = *(size_t *)(pdVar24[5].quick_len + 0x84);
                  *(size_t *)(pdVar24[5].quick_len + 0x84) = sVar32 - sVar43;
                  if (local_250 == puVar42) {
                    p = *(uint8_t **)(pdVar24[5].quick_num + 0x202);
                    prVar39 = local_258;
                    goto LAB_00129e5d;
                  }
                } while (sVar32 != sVar43);
                pdVar24->decode_len[2] = pdVar24->decode_len[2] + 1;
                wVar15 = advance_multivolume(a);
                local_260->decode_len[2] = local_260->decode_len[2] + -1;
                pdVar24 = local_260;
              } while (wVar15 == L'\0');
              goto LAB_0012a984;
            }
            iVar17 = 0xc;
            pcVar29 = "Can\'t allocate memory for a merge block buffer.";
          }
          else {
            iVar17 = 0x16;
            pcVar29 = "Recursive merge is not allowed";
          }
LAB_0012a975:
          archive_set_error(&a->archive,iVar17,pcVar29);
          goto LAB_0012a97c;
        }
        pcVar29 = "Unsupported block header size (was %d, max is 2)";
        goto LAB_0012aba5;
      }
LAB_00129c68:
      prVar39 = (rar5 *)a->format->data;
      bVar13 = *(byte *)&prVar39->cstate;
      *(byte *)&prVar39->cstate = bVar13 & 0xfd;
      if ((prVar39->cstate).filters.size == 0) {
LAB_00129cc7:
        *(byte *)&prVar39->cstate = bVar13 | 2;
        if ((prVar11->cstate).filters.size == 0) {
          lVar25 = (prVar11->cstate).write_ptr;
        }
        else {
          lVar28 = *(long *)((prVar11->cstate).filters.arr[(prVar11->cstate).filters.beg_pos] + 0x10
                            );
          lVar25 = (prVar11->cstate).write_ptr;
          if (lVar28 < lVar25) {
            lVar25 = lVar28;
          }
        }
        lVar28 = (prVar11->cstate).last_write_ptr;
        wVar15 = L'\xfffffff6';
        if (lVar25 == lVar28) goto LAB_0012a9c8;
        push_window_data(a,prVar11,lVar28,lVar25);
        (prVar11->cstate).last_write_ptr = lVar25;
        goto LAB_0012aaee;
      }
      puVar22 = (uint *)(prVar39->cstate).filters.arr[(prVar39->cstate).filters.beg_pos];
      lVar25 = (prVar39->cstate).write_ptr;
      lVar28 = *(long *)(puVar22 + 4);
      table._0_8_ = puVar22;
      if ((lVar25 <= lVar28) || (lVar25 < *(long *)(puVar22 + 6) + lVar28)) goto LAB_00129cc7;
      lVar25 = (prVar39->cstate).last_write_ptr;
      if (lVar25 != lVar28) {
        push_window_data(a,prVar39,lVar25,lVar28);
        goto LAB_0012aaee;
      }
      prVar11 = (rar5 *)a->format->data;
      (prVar11->cstate).dready[1].size = 0;
      (prVar11->cstate).dready[1].offset = 0;
      *(undefined8 *)((prVar11->cstate).dready + 1) = 0;
      (prVar11->cstate).dready[1].buf = (uint8_t *)0x0;
      (prVar11->cstate).dready[0].size = 0;
      (prVar11->cstate).dready[0].offset = 0;
      *(undefined8 *)(prVar11->cstate).dready = 0;
      (prVar11->cstate).dready[0].buf = (uint8_t *)0x0;
      free((prVar11->cstate).filtered_buf);
      sVar33 = *(size_t *)(puVar22 + 6);
      pdVar24 = (decode_table *)malloc(sVar33);
      (prVar11->cstate).filtered_buf = (uint8_t *)pdVar24;
      if (pdVar24 == (decode_table *)0x0) {
        pcVar29 = "Can\'t allocate memory for filter data.";
        iVar17 = 0xc;
        goto LAB_0012abcd;
      }
      uVar38 = *puVar22;
      uVar30 = (ulong)uVar38;
      if (1 < uVar38 - 1) {
        if (uVar38 == 3) {
          prVar31 = (rar5 *)(prVar11->cstate).window_buf;
          uVar30 = (prVar11->cstate).window_mask;
          uVar35 = *(long *)(puVar22 + 4) + (prVar11->cstate).solid_offset;
          uVar36 = uVar35 & uVar30;
          uVar35 = uVar35 + sVar33 & uVar30;
          if ((long)uVar35 < (long)uVar36) {
            local_250 = (uint8_t *)(uVar30 - uVar36);
            local_260 = pdVar24;
            local_258 = prVar31;
            memcpy(pdVar24,(uint8_t *)((long)&prVar31->header_initialized + uVar36),
                   (size_t)(local_250 + 1));
            pdVar24 = (decode_table *)(local_250 + (long)((long)local_260->decode_len + -3));
            prVar31 = local_258;
          }
          else {
            prVar31 = (rar5 *)((long)&prVar31->header_initialized + uVar36);
            uVar35 = sVar33;
          }
          memcpy(pdVar24,prVar31,uVar35);
          for (local_278 = 0; (long)local_278 < (long)(sVar33 - 3); local_278 = local_278 + 4) {
            lVar25 = (prVar11->cstate).solid_offset + *(long *)(puVar22 + 4);
            uVar30 = (prVar11->cstate).window_mask;
            if ((prVar11->cstate).window_buf[local_278 + lVar25 + 3 & uVar30] == 0xeb) {
              uVar18 = read_filter_data(prVar11,(int)lVar25 + (int)local_278 & (uint)uVar30);
              iVar17 = (int)((long)(*(long *)(puVar22 + 4) + local_278) / -4) + uVar18;
              puVar42 = (prVar11->cstate).filtered_buf;
              uVar30 = local_278 & 0xffffffff;
              puVar42[uVar30] = (uint8_t)iVar17;
              puVar42[uVar30 + 1] = (uint8_t)((uint)iVar17 >> 8);
              puVar42[uVar30 + 2] = (uint8_t)((uint)iVar17 >> 0x10);
              puVar42[uVar30 + 3] = 0xeb;
              sVar33 = *(size_t *)(puVar22 + 6);
            }
          }
        }
        else {
          if (uVar38 != 0) {
            pcVar29 = "Unsupported filter type: 0x%x";
LAB_0012aba5:
            archive_set_error(&a->archive,0x54,pcVar29,uVar30);
            return L'\xffffffe2';
          }
          uVar30 = (ulong)puVar22[1];
          lVar28 = 0;
          for (lVar25 = 0; lVar25 < (int)uVar30; lVar25 = lVar25 + 1) {
            uVar34 = '\0';
            for (lVar37 = lVar25; lVar37 < (long)sVar33; lVar37 = lVar37 + uVar30) {
              uVar34 = uVar34 - (prVar11->cstate).window_buf
                                [(prVar11->cstate).solid_offset + *(long *)(puVar22 + 4) + lVar28 &
                                 (prVar11->cstate).window_mask];
              (prVar11->cstate).filtered_buf[lVar37] = uVar34;
              lVar28 = lVar28 + 1;
              uVar30 = (ulong)(int)puVar22[1];
              sVar33 = *(size_t *)(puVar22 + 6);
            }
          }
        }
LAB_0012af8f:
        wVar19 = push_data_ready(a,prVar11,(prVar11->cstate).filtered_buf,sVar33,
                                 (prVar11->cstate).last_write_ptr);
        if (wVar19 != L'\0') {
          pcVar29 = "Stack overflow when submitting unpacked data";
          iVar17 = 0x16;
          goto LAB_0012abcd;
        }
        piVar5 = &(prVar11->cstate).last_write_ptr;
        *piVar5 = *piVar5 + *(long *)(puVar22 + 6);
        cdeque_pop_front(&(prVar39->cstate).filters,(void **)table);
        free((void *)table._0_8_);
        goto LAB_0012aaee;
      }
      puVar42 = (prVar11->cstate).window_buf;
      uVar30 = (prVar11->cstate).window_mask;
      uVar35 = *(long *)(puVar22 + 4) + (prVar11->cstate).solid_offset;
      uVar36 = uVar35 & uVar30;
      local_258 = (rar5 *)(uVar35 + sVar33 & uVar30);
      if ((long)local_258 < (long)uVar36) {
        local_238 = (decode_table *)(uVar30 - uVar36);
        local_260 = pdVar24;
        local_250 = puVar42;
        memcpy(pdVar24,puVar42 + uVar36,(size_t)((long)&local_238->size + 1));
        pdVar24 = (decode_table *)((long)local_238->decode_len + (long)local_260->decode_len + -7);
        prVar31 = local_258;
        puVar42 = local_250;
      }
      else {
        puVar42 = puVar42 + uVar36;
        prVar31 = (rar5 *)sVar33;
      }
      memcpy(pdVar24,puVar42,(size_t)prVar31);
      local_258 = (rar5 *)0x0;
      goto LAB_0012ae17;
    }
    if (wVar19 != L'\0') {
      archive_set_error(&a->archive,0x54,"Compression method not supported: 0x%x");
      return L'\xffffffe2';
    }
  }
  sVar43 = (rar->file).bytes_remaining;
  if (sVar43 == 0) {
    wVar19 = L'\x01';
    wVar15 = wVar19;
    if ((((ulong)rar->main & 2) == 0) ||
       ((undefined1  [12])((undefined1  [12])rar->generic & (undefined1  [12])0x1) ==
        (undefined1  [12])0x0)) goto LAB_0012aae4;
    *(byte *)&rar->cstate = *(byte *)&rar->cstate | 4;
    wVar15 = advance_multivolume(a);
    *(byte *)&rar->cstate = *(byte *)&rar->cstate & 0xfb;
    if (wVar15 != L'\0') goto LAB_0012aae4;
    sVar43 = (rar->file).bytes_remaining;
    sVar32 = 0x10000;
    if ((long)sVar43 < 0x10000) {
      sVar32 = sVar43;
    }
    wVar15 = wVar19;
    if (sVar43 == 0) goto LAB_0012aae4;
  }
  else {
    sVar32 = 0x10000;
    if ((long)sVar43 < 0x10000) {
      sVar32 = sVar43;
    }
  }
  wVar19 = read_ahead(a,sVar32,(uint8_t **)table);
  if (wVar19 == L'\0') {
    archive_set_error(&a->archive,0x54,"I/O error when unstoring file");
    wVar15 = L'\xffffffe2';
  }
  else {
    wVar19 = consume(a,sVar32);
    if (wVar19 == L'\0') {
      if (buff != (void **)0x0) {
        *buff = (void *)table._0_8_;
      }
      if (size != (size_t *)0x0) {
        *size = sVar32;
      }
      lVar25 = (rar->cstate).last_unstore_ptr;
      if (offset != (int64_t *)0x0) {
        *offset = lVar25;
      }
      (rar->file).bytes_remaining = (rar->file).bytes_remaining - sVar32;
      (rar->cstate).last_unstore_ptr = lVar25 + sVar32;
      update_crc(rar,(uint8_t *)table._0_8_,sVar32);
      wVar15 = L'\0';
    }
    else {
      wVar15 = L'\x01';
    }
  }
LAB_0012aae4:
  if (wVar15 != L'\0') {
    return wVar15;
  }
LAB_0012aaee:
  if ((rar->file).bytes_remaining != 0) {
    return L'\0';
  }
  if ((rar->cstate).last_write_ptr != (rar->file).unpacked_size) {
    return L'\0';
  }
  puVar4 = &(rar->file).field_0x20;
  *puVar4 = *puVar4 | 4;
  pvVar23 = a->format->data;
  if (*(int *)((long)pvVar23 + 8) != 0) {
    return L'\0';
  }
  if ((*(int *)((long)pvVar23 + 0x4bf4) == 0) ||
     (*(int *)((long)pvVar23 + 0x4bf8) == *(int *)((long)pvVar23 + 0x4bf4))) {
    if (*(char *)((long)pvVar23 + 0x52f8) < '\x01') {
      return L'\0';
    }
    blake2sp_final((blake2sp_state *)((long)pvVar23 + 0x4c20),table,0x20);
    iVar17 = bcmp((void *)((long)pvVar23 + 0x4bfc),table,0x20);
    if (iVar17 == 0) {
      return L'\0';
    }
    pcVar29 = "Checksum error: BLAKE2";
  }
  else {
    pcVar29 = "Checksum error: CRC32";
  }
LAB_0012abcb:
  iVar17 = 0x54;
LAB_0012abcd:
  archive_set_error(&a->archive,iVar17,pcVar29);
  return L'\xffffffe2';
LAB_0012a66a:
  if ((int)uVar38 < 0x1ae) {
    wVar15 = decode_number(a,pdVar24,puVar21,&num);
    prVar39 = local_258;
    if (wVar15 != L'\0') {
      iVar17 = 0x54;
      pcVar29 = "Decoding huffman tables failed";
      goto LAB_0012a975;
    }
    uVar12 = num;
    if (num < 0x10) {
      table[(int)uVar38] = (uint8_t)_num;
      uVar38 = uVar38 + 1;
    }
    else if (num < 0x12) {
      wVar15 = read_bits_16(a,local_258,puVar21,&local_262);
      if (wVar15 != L'\0') goto LAB_0012a984;
      iVar17 = (int)(prVar39->bits).bit_addr + (uint)(uVar12 != 0x10) * 4 + 3;
      pwVar2 = &(prVar39->bits).in_addr;
      *pwVar2 = *pwVar2 + (iVar17 >> 3);
      (prVar39->bits).bit_addr = (byte)iVar17 & 7;
      if ((int)uVar38 < 1) {
        iVar17 = 0x54;
        pcVar29 = "Unexpected error when decoding huffman tables";
        goto LAB_0012a975;
      }
      for (lVar25 = 0;
          (iVar17 = (int)lVar25,
          (ushort)((((ushort)(uVar12 == 0x10) << 3 | 0xfff5) -
                   (local_262 >> ((uVar12 == 0x10) * '\x04' | 9U))) + (short)lVar25) != 0 &&
          ((int)(uVar38 + iVar17) < 0x1ae)); lVar25 = lVar25 + 1) {
        table[lVar25 + (ulong)uVar38] = table[(uVar38 - 1) + iVar17];
      }
      uVar38 = uVar38 + iVar17;
      prVar39 = local_258;
      pdVar24 = local_260;
    }
    else {
      wVar15 = read_bits_16(a,local_258,puVar21,&local_262);
      if (wVar15 != L'\0') goto LAB_0012a984;
      bVar44 = uVar12 == 0x12;
      iVar17 = (int)(prVar39->bits).bit_addr + (uint)!bVar44 * 4 + 3;
      pwVar2 = &(prVar39->bits).in_addr;
      *pwVar2 = *pwVar2 + (iVar17 >> 3);
      (prVar39->bits).bit_addr = (byte)iVar17 & 7;
      iVar17 = 0;
      for (lVar25 = (long)(int)uVar38;
          ((ushort)(((ushort)bVar44 * 8 | 0xfff5) - (local_262 >> (bVar44 << 2 | 9U))) !=
           (short)iVar17 && (lVar25 < 0x1ae)); lVar25 = lVar25 + 1) {
        table[lVar25] = '\0';
        iVar17 = iVar17 + -1;
      }
      uVar38 = uVar38 - iVar17;
      pdVar24 = local_260;
    }
    goto LAB_0012a66a;
  }
  create_decode_tables(table,&(prVar39->cstate).ld,L'Ĳ');
  create_decode_tables(table + 0x132,&(prVar39->cstate).dd,L'@');
  create_decode_tables(table + 0x172,&(prVar39->cstate).ldd,L'\x10');
  create_decode_tables(table + 0x182,&(prVar39->cstate).rd,L',');
LAB_00129e8f:
  puVar42 = p;
  prVar39 = (rar5 *)a->format->data;
  local_250 = (uint8_t *)(prVar39->cstate).window_mask;
  local_260 = (decode_table *)
              (CONCAT71(local_260._1_7_,(prVar39->last_block_hdr).block_flags_u8) &
              0xffffffffffffff07);
  local_238 = &(prVar39->cstate).ld;
  pdVar24 = local_238;
LAB_00129ee9:
  prVar31 = local_258;
  if ((prVar39->cstate).window_size >> 1 <
      (prVar39->cstate).write_ptr - (prVar39->cstate).last_write_ptr) {
LAB_0012a3d1:
    bVar13 = *(byte *)&local_258->cstate;
    if ((bVar13 & 0xc) == 8) {
      lVar25 = (local_258->cstate).cur_block_size;
      if (0 < lVar25) {
        wVar15 = consume(a,lVar25);
        if (wVar15 != L'\0') {
          return L'\xffffffe2';
        }
        pfVar3 = &prVar31->file;
        pfVar3->bytes_remaining = pfVar3->bytes_remaining - (prVar31->cstate).cur_block_size;
      }
    }
    else if ((bVar13 & 4) != 0) {
      *(byte *)&local_258->cstate = bVar13 & 0xfb;
    }
    goto LAB_0012a98e;
  }
  lVar28 = (long)(prVar39->bits).in_addr;
  lVar25 = (prVar39->cstate).cur_block_size;
  if ((lVar25 <= lVar28) ||
     ((lVar25 + -1 == lVar28 && ((char)(byte)local_260 < (prVar39->bits).bit_addr)))) {
    *(byte *)&prVar39->cstate = *(byte *)&prVar39->cstate | 8;
    goto LAB_0012a3d1;
  }
  wVar14 = decode_number(a,pdVar24,puVar42,&num_1);
  wVar15 = wVar19;
  if (wVar14 != L'\0') goto LAB_0012a984;
  if (num_1 < 0x100) {
    lVar25 = (prVar39->cstate).write_ptr;
    (prVar39->cstate).write_ptr = lVar25 + 1;
    (prVar39->cstate).window_buf[lVar25 + (prVar39->cstate).solid_offset & (ulong)local_250] =
         (uint8_t)num_1;
    goto LAB_00129ee9;
  }
  if (num_1 < 0x106) {
    if (num_1 == 0x101) {
      wVar15 = (prVar39->cstate).last_len;
      if ((wVar15 != L'\0') &&
         (wVar15 = copy_string(a,wVar15,(prVar39->cstate).dist_cache[0]), wVar15 != L'\0'))
      goto LAB_0012a97c;
      goto LAB_00129ee9;
    }
    if (num_1 == 0x100) {
      prVar31 = (rar5 *)a->format->data;
      wVar15 = parse_filter_data(a,prVar31,puVar42,(uint32_t *)table);
      if (((wVar15 != L'\0') ||
          (wVar15 = parse_filter_data(a,prVar31,puVar42,(uint32_t *)bit_length), wVar15 != L'\0'))
         || (wVar15 = read_bits_16(a,prVar31,puVar42,&local_262), wVar15 != L'\0'))
      goto LAB_0012a984;
      iVar17 = (prVar31->bits).bit_addr + 3;
      pwVar2 = &(prVar31->bits).in_addr;
      *pwVar2 = *pwVar2 + (iVar17 >> 3);
      (prVar31->bits).bit_addr = (byte)iVar17 & 7;
      uVar30 = (ulong)(uint)bit_length._0_4_;
      if ((0xffc00002 < bit_length._0_4_ - 0x400001) && (-1 < (short)local_262)) {
        uVar35 = table._0_8_ & 0xffffffff;
        lVar25 = (prVar31->cstate).last_block_start;
        lVar28 = (prVar31->cstate).last_block_length;
        if ((lVar28 == 0 || lVar25 == 0) ||
           (lVar28 + lVar25 <= (long)((prVar31->cstate).write_ptr + uVar35))) {
          local_22c = (uint)local_262;
          puVar22 = (uint *)calloc(1,0x28);
          if (puVar22 == (uint *)0x0) {
            iVar17 = 0xc;
            pcVar29 = "Can\'t allocate memory for a filter descriptor.";
            goto LAB_0012a975;
          }
          uVar8 = (prVar31->cstate).filters.size;
          uVar9 = (prVar31->cstate).filters.cap_mask;
          if (uVar9 + 1 != (uint)uVar8) {
            uVar10 = (prVar31->cstate).filters.end_pos;
            (prVar31->cstate).filters.arr[uVar10] = (size_t)puVar22;
            (prVar31->cstate).filters.end_pos = uVar9 & uVar10 + 1;
            (prVar31->cstate).filters.size = uVar8 + 1;
          }
          *puVar22 = local_22c >> 0xd;
          lVar25 = uVar35 + (prVar31->cstate).write_ptr;
          *(long *)(puVar22 + 4) = lVar25;
          *(ulong *)(puVar22 + 6) = uVar30;
          (prVar31->cstate).last_block_start = lVar25;
          (prVar31->cstate).last_block_length = uVar30;
          pdVar24 = local_238;
          if ((ushort)local_22c < 0x2000) {
            wVar15 = read_consume_bits(a,prVar31,puVar42,L'\x05',(wchar_t *)&num);
            if (wVar15 != L'\0') goto LAB_0012a984;
            puVar22[1] = _num + L'\x01';
            pdVar24 = local_238;
          }
          goto LAB_00129ee9;
        }
      }
      iVar17 = 0x54;
      pcVar29 = "Invalid filter encountered";
      goto LAB_0012a975;
    }
    uVar30 = (ulong)(num_1 - 0x102);
    wVar15 = (prVar39->cstate).dist_cache[uVar30];
    for (; 0 < (int)uVar30; uVar30 = uVar30 - 1) {
      (prVar39->cstate).dist_cache[uVar30] = (prVar39->cstate).dist_cache[uVar30 - 1];
    }
    (prVar39->cstate).dist_cache[0] = wVar15;
    wVar14 = decode_number(a,&(prVar39->cstate).rd,puVar42,(uint16_t *)table);
    if (wVar14 != L'\0') goto LAB_0012a97c;
    wVar14 = decode_code_length(a,prVar39,puVar42,table._0_2_);
    if (wVar14 == L'\xffffffff') goto LAB_0012a97c;
    (prVar39->cstate).last_len = wVar14;
    wVar15 = copy_string(a,wVar14,wVar15);
  }
  else {
    wVar14 = decode_code_length(a,prVar39,puVar42,num_1 - 0x106);
    if (wVar14 == L'\xffffffff') {
      iVar17 = 0x16;
      pcVar29 = "Failed to decode the code length";
      goto LAB_0012a975;
    }
    wVar15 = decode_number(a,&(prVar39->cstate).dd,puVar42,(uint16_t *)bit_length);
    if (wVar15 != L'\0') {
LAB_0012a84e:
      iVar17 = 0x16;
      pcVar29 = "Failed to decode the distance slot";
      goto LAB_0012a975;
    }
    if ((ushort)bit_length._0_2_ < 4) {
      wVar15 = (bit_length._0_4_ & 0xffff) + L'\x01';
    }
    else {
      uVar8 = (ushort)bit_length._0_2_ >> 1;
      wVar15 = (uint)uVar8 + L'\xffffffff';
      iVar17 = ((bit_length._0_4_ & 1 | 2) << ((byte)wVar15 & 0x1f)) + 1;
      if ((uint)wVar15 < 4) {
        wVar15 = read_consume_bits(a,prVar39,puVar42,wVar15,(wchar_t *)table);
        if (wVar15 != L'\0') goto LAB_0012a984;
        wVar15 = iVar17 + table._0_4_;
      }
      else {
        if (wVar15 != L'\x04') {
          wVar15 = (prVar39->bits).in_addr;
          lVar25 = (long)wVar15;
          if ((prVar39->cstate).cur_block_size <= lVar25) {
            iVar17 = 0x16;
            pcVar29 = "Premature end of stream during extraction of data (#1)";
            goto LAB_0012a975;
          }
          uVar38 = *(uint *)(puVar42 + lVar25);
          bVar13 = (prVar39->bits).bit_addr;
          bVar6 = puVar42[lVar25 + 4];
          iVar16 = (int)(char)bVar13 + (uint)uVar8 + -5;
          (prVar39->bits).in_addr = (iVar16 >> 3) + wVar15;
          (prVar39->bits).bit_addr = (byte)iVar16 & 7;
          iVar17 = iVar17 + (((uint)(bVar6 >> (8 - bVar13 & 0x1f)) |
                             (uVar38 >> 0x18 | (uVar38 & 0xff0000) >> 8 | (uVar38 & 0xff00) << 8 |
                             uVar38 << 0x18) << (bVar13 & 0x1f)) >> (0x25U - (char)uVar8 & 0x1f)) *
                            0x10;
        }
        wVar15 = decode_number(a,&(prVar39->cstate).ldd,puVar42,(uint16_t *)table);
        if (wVar15 != L'\0') goto LAB_0012a84e;
        if ((int)(0x7ffffffe - (uint)(ushort)table._0_2_) <= iVar17) {
          iVar17 = 0x54;
          pcVar29 = "Distance pointer overflow";
          goto LAB_0012a975;
        }
        wVar15 = iVar17 + (uint)(ushort)table._0_2_;
      }
    }
    if (L'Ā' < wVar15) {
      if ((uint)wVar15 < 0x2001) {
        wVar14 = wVar14 + L'\x01';
      }
      else {
        wVar14 = (wVar14 - (uint)((uint)wVar15 < 0x40001)) + L'\x03';
      }
    }
    (prVar39->cstate).dist_cache[3] = (prVar39->cstate).dist_cache[2];
    *(undefined8 *)((prVar39->cstate).dist_cache + 1) = *(undefined8 *)(prVar39->cstate).dist_cache;
    (prVar39->cstate).dist_cache[0] = wVar15;
    (prVar39->cstate).last_len = wVar14;
    wVar15 = copy_string(a,wVar14,wVar15);
  }
  pdVar24 = local_238;
  if (wVar15 == L'\0') goto LAB_00129ee9;
LAB_0012a97c:
  wVar15 = L'\xffffffe2';
LAB_0012a984:
  if ((wVar15 == L'\xffffffe2') || (wVar15 == L'\x01')) goto LAB_0012a9c8;
LAB_0012a98e:
  if ((prVar11->cstate).last_write_ptr != (prVar11->cstate).write_ptr) goto LAB_00129c68;
  if (((prVar11->last_block_hdr).block_flags_u8 & 0x40) != 0) {
    return L'\x01';
  }
  goto LAB_00129d07;
LAB_0012a9c8:
  if (wVar15 != L'\xfffffff6') goto LAB_0012aae4;
  goto LAB_00129b63;
LAB_0012ae17:
  prVar31 = local_258;
  do {
    if ((long)(sVar33 - 4) <= (long)prVar31) goto LAB_0012af8f;
    lVar25 = (prVar11->cstate).solid_offset;
    lVar28 = *(long *)(puVar22 + 4);
    prVar1 = (rar5 *)((long)&prVar31->header_initialized + 1);
    uVar30 = (prVar11->cstate).window_mask;
    uVar34 = (prVar11->cstate).window_buf
             [(ulong)((long)&prVar31->header_initialized + lVar28 + lVar25) & uVar30];
  } while ((uVar34 != 0xe8) && (prVar31 = prVar1, uVar38 != 2 || uVar34 != 0xe9));
  local_258 = prVar1;
  uVar18 = read_filter_data(prVar11,(uint)uVar30 & (int)prVar1 + (int)lVar25 + (int)lVar28);
  iVar17 = (int)((long)((long)&prVar1->header_initialized + lVar28) % 0x1000000);
  if ((int)uVar18 < 0) {
    if (-1 < (int)(iVar17 + uVar18)) {
      uVar27 = uVar18 + 0x1000000;
      goto LAB_0012aeb2;
    }
  }
  else if (uVar18 < 0x1000000) {
    uVar18 = uVar18 - iVar17;
    uVar27 = uVar18;
LAB_0012aeb2:
    puVar42 = (prVar11->cstate).filtered_buf;
    uVar30 = (ulong)local_258 & 0xffffffff;
    puVar42[uVar30] = (uint8_t)uVar18;
    puVar42[uVar30 + 1] = (uint8_t)(uVar18 >> 8);
    puVar42[uVar30 + 2] = (uint8_t)(uVar18 >> 0x10);
    puVar42[uVar30 + 3] = (uint8_t)(uVar27 >> 0x18);
  }
  local_258 = (rar5 *)&local_258->skipped_magic;
  sVar33 = *(size_t *)(puVar22 + 6);
  goto LAB_0012ae17;
}

Assistant:

static int rar5_read_data(struct archive_read *a, const void **buff,
    size_t *size, int64_t *offset) {
	int ret;
	struct rar5* rar = get_context(a);

	if (size)
		*size = 0;

	if (rar->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		rar->has_encrypted_entries = 0;
	}

	if (rar->headers_are_encrypted || rar->cstate.data_encrypted) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Reading encrypted data is not currently supported");
		return ARCHIVE_FATAL;
	}

	if(rar->file.dir > 0) {
		/* Don't process any data if this file entry was declared
		 * as a directory. This is needed, because entries marked as
		 * directory doesn't have any dictionary buffer allocated, so
		 * it's impossible to perform any decompression. */
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't decompress an entry marked as a directory");
		return ARCHIVE_FAILED;
	}

	if(!rar->skip_mode && (rar->cstate.last_write_ptr > rar->file.unpacked_size)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
		    "Unpacker has written too many bytes");
		return ARCHIVE_FATAL;
	}

	ret = use_data(rar, buff, size, offset);
	if(ret == ARCHIVE_OK) {
		return ret;
	}

	if(rar->file.eof == 1) {
		return ARCHIVE_EOF;
	}

	ret = do_unpack(a, rar, buff, size, offset);
	if(ret != ARCHIVE_OK) {
		return ret;
	}

	if(rar->file.bytes_remaining == 0 &&
			rar->cstate.last_write_ptr == rar->file.unpacked_size)
	{
		/* If all bytes of current file were processed, run
		 * finalization.
		 *
		 * Finalization will check checksum against proper values. If
		 * some of the checksums will not match, we'll return an error
		 * value in the last `archive_read_data` call to signal an error
		 * to the user. */

		rar->file.eof = 1;
		return verify_global_checksums(a);
	}

	return ARCHIVE_OK;
}